

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDockAreaLayoutItem * __thiscall QDockAreaLayout::item(QDockAreaLayout *this,QList<int> *path)

{
  int iVar1;
  QDockAreaLayoutItem *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  QList<int>::mid((QList<int> *)&local_30,path,1,-1);
  pQVar2 = QDockAreaLayoutInfo::item(this->docks + iVar1,(QList<int> *)&local_30);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutItem &QDockAreaLayout::item(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].item(path.mid(1));
}